

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

void duckdb::string_util_internal::ConsumeLetter(string *str,idx_t *index,char expected)

{
  ulong uVar1;
  pointer pcVar2;
  ParserException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  uVar1 = *index;
  if ((uVar1 < str->_M_string_length) && ((str->_M_dataplus)._M_p[uVar1] == expected)) {
    *index = uVar1 + 1;
    return;
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Invalid quoted list: %s","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + str->_M_string_length);
  ParserException::ParserException<std::__cxx11::string>(this,&local_48,&local_68);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline void ConsumeLetter(const string &str, idx_t &index, char expected) {
	if (index >= str.size() || str[index] != expected) {
		throw ParserException("Invalid quoted list: %s", str);
	}

	index++;
}